

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json.c
# Opt level: O3

int json_print_attrs(lyout *out,int level,lyd_node *node,lys_module *wdmod)

{
  char *__s2;
  ly_ctx *ctx;
  int iVar1;
  int *piVar2;
  lys_module *plVar3;
  lys_module *plVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  lyd_attr *plVar8;
  
  piVar2 = __errno_location();
  *piVar2 = 0;
  if (wdmod != (lys_module *)0x0) {
    ly_print(out,"%*s\"%s:default\":\"true\"",(ulong)(uint)(level * 2),"",wdmod->name);
    pcVar7 = ",";
    if (node->attr == (lyd_attr *)0x0) {
      pcVar7 = "";
    }
    pcVar6 = "\n";
    if (level == 0) {
      pcVar6 = "";
    }
    ly_print(out,"%s%s",pcVar7,pcVar6);
  }
  plVar8 = node->attr;
  if (plVar8 != (lyd_attr *)0x0) {
    pcVar7 = "\n";
    if (level == 0) {
      pcVar7 = "";
    }
    do {
      if (plVar8->annotation != (lys_ext_instance_complex *)0x0) {
        plVar3 = lys_main_module(plVar8->annotation->module);
        plVar4 = lys_main_module(node->schema->module);
        if (plVar3 == plVar4) {
          ly_print(out,"%*s\"%s\":",(ulong)(uint)(level * 2),"",plVar8->name);
        }
        else {
          ly_print(out,"%*s\"%s:%s\":",(ulong)(uint)(level * 2),"",plVar8->annotation->module->name,
                   plVar8->name);
        }
        switch(plVar8->value_type) {
        case LY_TYPE_BINARY:
        case LY_TYPE_BITS:
        case LY_TYPE_DEC64:
        case LY_TYPE_ENUM:
        case LY_TYPE_INST:
        case LY_TYPE_STRING:
        case LY_TYPE_INT64:
        case LY_TYPE_UINT64:
          json_print_string(out,plVar8->value_str);
          break;
        case LY_TYPE_BOOL:
        case LY_TYPE_INT8:
        case LY_TYPE_UINT8:
        case LY_TYPE_INT16:
        case LY_TYPE_UINT16:
        case LY_TYPE_INT32:
        case LY_TYPE_UINT32:
          pcVar6 = plVar8->value_str;
          if (*pcVar6 == '\0') {
            pcVar6 = "null";
          }
          ly_print(out,"%s",pcVar6);
          break;
        case LY_TYPE_EMPTY:
          ly_print(out,"[null]");
          break;
        case LY_TYPE_IDENT:
          pcVar6 = plVar8->value_str;
          pcVar5 = strchr(pcVar6,0x3a);
          if (pcVar5 == (char *)0x0) {
            __assert_fail("p",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/printer_json.c"
                          ,0x73,
                          "int json_print_attrs(struct lyout *, int, const struct lyd_node *, const struct lys_module *)"
                         );
          }
          __s2 = plVar8->annotation->module->name;
          iVar1 = strncmp(pcVar6,__s2,(long)pcVar5 - (long)pcVar6);
          if ((iVar1 == 0) && (__s2[(long)pcVar5 - (long)pcVar6] == '\0')) {
            pcVar6 = pcVar5 + 1;
          }
          json_print_string(out,pcVar6);
          break;
        default:
          ly_log(node->schema->module->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/printer_json.c"
                 ,0x84);
          goto LAB_0019b5ba;
        }
        pcVar6 = ",";
        if (plVar8->next == (lyd_attr *)0x0) {
          pcVar6 = "";
        }
        ly_print(out,"%s%s",pcVar6,pcVar7);
      }
      plVar8 = plVar8->next;
    } while (plVar8 != (lyd_attr *)0x0);
  }
  if (*piVar2 == 0) {
    iVar1 = 0;
  }
  else {
    ctx = node->schema->module->ctx;
    pcVar7 = strerror(*piVar2);
    ly_log(ctx,LY_LLERR,LY_ESYS,"Print error (%s).",pcVar7);
LAB_0019b5ba:
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int
json_print_attrs(struct lyout *out, int level, const struct lyd_node *node, const struct lys_module *wdmod)
{
    struct lyd_attr *attr;
    size_t len;
    char *p;

    LY_PRINT_SET;

    if (wdmod) {
        ly_print(out, "%*s\"%s:default\":\"true\"", LEVEL, INDENT, wdmod->name);
        ly_print(out, "%s%s", node->attr ? "," : "", (level ? "\n" : ""));
    }
    for (attr = node->attr; attr; attr = attr->next) {
        if (!attr->annotation) {
            /* skip exception for the NETCONF's attribute since JSON is not defined for NETCONF */
            continue;
        }
        if (lys_main_module(attr->annotation->module) != lys_main_module(node->schema->module)) {
            ly_print(out, "%*s\"%s:%s\":", LEVEL, INDENT, attr->annotation->module->name, attr->name);
        } else {
            ly_print(out, "%*s\"%s\":", LEVEL, INDENT, attr->name);
        }
        /* leafref is not supported */
        switch (attr->value_type) {
        case LY_TYPE_BINARY:
        case LY_TYPE_STRING:
        case LY_TYPE_BITS:
        case LY_TYPE_ENUM:
        case LY_TYPE_INST:
        case LY_TYPE_INT64:
        case LY_TYPE_UINT64:
        case LY_TYPE_DEC64:
            json_print_string(out, attr->value_str);
            break;

        case LY_TYPE_INT8:
        case LY_TYPE_INT16:
        case LY_TYPE_INT32:
        case LY_TYPE_UINT8:
        case LY_TYPE_UINT16:
        case LY_TYPE_UINT32:
        case LY_TYPE_BOOL:
            ly_print(out, "%s", attr->value_str[0] ? attr->value_str : "null");
            break;

        case LY_TYPE_IDENT:
            p = strchr(attr->value_str, ':');
            assert(p);
            len = p - attr->value_str;
            if (!strncmp(attr->value_str, attr->annotation->module->name, len)
                    && !attr->annotation->module->name[len]) {
                /* do not print the prefix, it is the default prefix for this node */
                json_print_string(out, ++p);
            } else {
                json_print_string(out, attr->value_str);
            }
            break;

        case LY_TYPE_EMPTY:
            ly_print(out, "[null]");
            break;

        default:
            /* error */
            LOGINT(node->schema->module->ctx);
            return EXIT_FAILURE;
        }

        ly_print(out, "%s%s", attr->next ? "," : "", (level ? "\n" : ""));
    }

    LY_PRINT_RET(node->schema->module->ctx);
}